

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O1

void test_write_two_buffers_one_chunk(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh;
  cio_write_buffer local_78;
  cio_write_buffer local_58;
  cio_write_buffer local_38;
  
  ms = (memory_stream *)malloc(0x100);
  local_78.prev = &local_58;
  local_58.data.head.q_len = (long)"MYHelloWorld" + 2;
  local_58.data.element.length = 5;
  local_78.data.head.q_len = (long)"MYHelloWorld" + 7;
  local_78.data.element.length = 5;
  local_38.data.head.q_len = 2;
  local_38.data.element.length = 10;
  local_78.next = &local_38;
  local_58.next = &local_78;
  local_58.prev = &local_38;
  local_38.next = local_78.prev;
  local_38.prev = &local_78;
  iVar1 = memory_stream_init(ms,"");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x6e6,UNITY_DISPLAY_STYLE_INT);
  write_some_fake.custom_fake = write_some_all;
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x6ea,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_write(buffered_stream,&local_38,dummy_write_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x6ec,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close(buffered_stream);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x6ef,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x6f0,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x6f1,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_write_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x6f2,UNITY_DISPLAY_STYLE_INT);
  if (write_check_buffer._8_2_ == 0x646c && write_check_buffer._0_8_ == 0x726f576f6c6c6548) {
    return;
  }
  UnityFail("Data was not written correctly!",0x6f3);
}

Assistant:

static void test_write_two_buffers_one_chunk(void)
{
	static const char *test_data = "HelloWorld";

	struct client *client = malloc(sizeof(*client));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, test_data, strlen(test_data) / 2);
	cio_write_buffer_queue_tail(&wbh, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, test_data + (strlen(test_data) / 2), strlen(test_data) - strlen(test_data) / 2);
	cio_write_buffer_queue_tail(&wbh, &wb2);

	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, ""), "Could not allocate memory for test!");
	write_some_fake.custom_fake = write_some_all;

	enum cio_error err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_write_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_write_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)write_check_buffer, test_data, strlen(test_data)) == 0, "Data was not written correctly!");
}